

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O3

DWORD ResumeThread(HANDLE hThread)

{
  PAL_ERROR PVar1;
  DWORD DVar2;
  CPalThread *pthrResumer;
  PAL_ERROR *pPVar3;
  DWORD local_1c [2];
  DWORD dwSuspendCount;
  
  local_1c[0] = 0xffffffff;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_001443d6;
  pthrResumer = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pthrResumer == (CPalThread *)0x0) {
    pthrResumer = CreateCurrentThreadData();
  }
  PVar1 = CorUnix::InternalResumeThread(pthrResumer,hThread,local_1c);
  if (PVar1 == 0) {
    DVar2 = local_1c[0];
    if (local_1c[0] == 0xffffffff) {
      fprintf(_stderr,"] %s %s:%d","ResumeThread",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
              ,0xa5);
      fprintf(_stderr,
              "Expression: dwSuspendCount != static_cast<DWORD>(-1), Description: InternalResumeThread returned success but dwSuspendCount did not change.\n"
             );
      goto LAB_00144379;
    }
  }
  else {
    pPVar3 = (PAL_ERROR *)__errno_location();
    *pPVar3 = PVar1;
LAB_00144379:
    DVar2 = 0xffffffff;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return DVar2;
  }
LAB_001443d6:
  abort();
}

Assistant:

DWORD
PALAPI
ResumeThread(
         IN HANDLE hThread
         )
{
    PAL_ERROR palError;
    CPalThread *pthrResumer;
    DWORD dwSuspendCount = (DWORD)-1;

    PERF_ENTRY(ResumeThread);
    ENTRY("ResumeThread(hThread=%p)\n", hThread);

    pthrResumer = InternalGetCurrentThread();
    palError = InternalResumeThread(
        pthrResumer,
        hThread,
        &dwSuspendCount
        );

    if (NO_ERROR != palError)
    {
        pthrResumer->SetLastError(palError);
        dwSuspendCount = (DWORD) -1;
    }
    else
    {
        _ASSERT_MSG(dwSuspendCount != static_cast<DWORD>(-1), "InternalResumeThread returned success but dwSuspendCount did not change.\n");
    }

    LOGEXIT("ResumeThread returns DWORD %u\n", dwSuspendCount);
    PERF_EXIT(ResumeThread);
    return dwSuspendCount;
}